

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::expected_lite::expected<void,char>const&>::operator!=
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::expected_lite::expected<void,char>const&> *this,
          expected<void,_char> *rhs)

{
  lest *this_00;
  bool bVar1;
  expected<void,_char> *in_R8;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  bVar1 = nonstd::expected_lite::operator==<void,_char,_void,_char,_0>
                    (*(expected<void,_char> **)this,rhs);
  this_00 = *(lest **)this;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"!=","");
  to_string<nonstd::expected_lite::expected<void,char>,nonstd::expected_lite::expected<void,char>>
            (&local_70,this_00,(expected<void,_char> *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = !bVar1;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }